

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void ArraySortEx(array *p,size_t Count,size_t Width,arraycmp Cmp,void *CmpParam,bool_t Unique)

{
  int iVar1;
  uint_fast32_t *puVar2;
  uint_fast32_t *puVar3;
  uint_fast32_t *puVar4;
  uint_fast32_t Tmp;
  uint_fast32_t local_48;
  bool_t local_40;
  uint_fast32_t *local_38;
  
  if (Count == 0xffffffffffffffff) {
    Count = p->_Used / Width;
  }
  if (1 < Count) {
    if (Width != 8) {
      SlowSort(p,Count,Width,Cmp,CmpParam,Unique);
      return;
    }
    local_40 = Unique;
    if (p == (array *)0x0) {
      __assert_fail("&(*p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x194,
                    "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)");
    }
    puVar3 = (uint_fast32_t *)p->_Begin;
    InQSort(puVar3,puVar3 + (Count - 1),Cmp,CmpParam);
    puVar2 = puVar3 + Count;
    puVar4 = (uint_fast32_t *)p->_Begin;
    local_38 = puVar3 + Count;
    while (puVar3 = puVar4, puVar4 = puVar3 + 1, puVar4 != puVar2) {
      iVar1 = (*Cmp)(CmpParam,puVar4,puVar3);
      if (iVar1 < 0) {
        local_48 = *puVar4;
        do {
          puVar2 = puVar3;
          puVar2[1] = *puVar2;
          if (puVar2 == (uint_fast32_t *)p->_Begin) break;
          iVar1 = (*Cmp)(CmpParam,&local_48,puVar2 + -1);
          puVar3 = puVar2 + -1;
        } while (iVar1 < 0);
        *puVar2 = local_48;
        puVar2 = local_38;
      }
    }
    if (local_40 != 0) {
      puVar3 = (uint_fast32_t *)p->_Begin;
      puVar4 = puVar3;
      while (puVar4 = puVar4 + 1, puVar4 != puVar2) {
        iVar1 = (*Cmp)(CmpParam,puVar4,puVar3);
        if (iVar1 != 0) {
          puVar3[1] = *puVar4;
          puVar3 = puVar3 + 1;
        }
      }
      p->_Used = (long)puVar3 + (8 - (long)p->_Begin);
    }
  }
  return;
}

Assistant:

void ArraySortEx(array* p, size_t Count, size_t Width, arraycmp Cmp, const void* CmpParam, bool_t Unique)
{
    if (Count == ARRAY_AUTO_COUNT)
        Count = ArraySize(p)/Width;

    if (Count<=1)
        return;

    if (Width == sizeof(uint_fast32_t))
    {
        uint_fast32_t* End = ARRAYBEGIN(*p,uint_fast32_t)+Count;
        uint_fast32_t* i;
        uint_fast32_t* j;

        InQSort(ARRAYBEGIN(*p,uint_fast32_t), End-1, Cmp, CmpParam);

        j = ARRAYBEGIN(*p,uint_fast32_t);
        for (i=j+1; i!=End; ++i)
        {
            if (Cmp(CmpParam,i,j) < 0)
            {
                uint_fast32_t Tmp = *i;
                do
                {
                    j[1] = j[0];
                    if (j-- == ARRAYBEGIN(*p,uint_fast32_t))
                        break;
                }
                while (Cmp(CmpParam,&Tmp,j) < 0);
                j[1] = Tmp;
            }
            j = i;
        }

        if (Unique)
        {
            j = ARRAYBEGIN(*p,uint_fast32_t);
            for (i=j+1; i!=End; ++i)
            {
                if (Cmp(CmpParam,i,j) != 0)
                    *(++j) = *i;
            }
            p->_Used = ((j+1)-ARRAYBEGIN(*p,uint_fast32_t)) * sizeof(uint_fast32_t);
        }
        return;
    }

    SlowSort(p, Count, Width, Cmp, CmpParam, Unique);
}